

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteCord
          (CopyingOutputStreamAdaptor *this,Cord *cord)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dd;
  ChunkIterator __begin2;
  ChunkIterator local_b8;
  
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  local_b8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  local_b8.bytes_remaining_ = 0;
  local_b8.current_chunk_ = (string_view)ZEXT816(0);
  local_b8.btree_reader_.remaining_ = 0;
  local_b8.btree_reader_.navigator_.height_ = -1;
  bVar1 = (cord->contents_).data_.rep_.field_0.data[0];
  tree = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) != 0) goto LAB_002408ed;
    local_b8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
    local_b8.current_chunk_._M_str = (char *)((long)&(cord->contents_).data_.rep_.field_0 + 1);
    local_b8.current_chunk_._M_len = local_b8.bytes_remaining_;
  }
  else {
    local_b8.bytes_remaining_ = tree->length;
    if (local_b8.bytes_remaining_ == 0) goto LAB_002408f2;
    absl::lts_20250127::Cord::ChunkIterator::InitTree(&local_b8,tree);
  }
  do {
    bVar4 = local_b8.bytes_remaining_ == 0;
    if (bVar4) {
      return bVar4;
    }
    iVar2 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[5])
                      (this,local_b8.current_chunk_._M_str,
                       (ulong)(uint)local_b8.current_chunk_._M_len);
    if ((char)iVar2 == '\0') {
      return bVar4;
    }
    while (local_b8.bytes_remaining_ != 0) {
      uVar3 = local_b8.bytes_remaining_ - local_b8.current_chunk_._M_len;
      if (local_b8.bytes_remaining_ < local_b8.current_chunk_._M_len) {
        __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                      ,0x611,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
      }
      local_b8.bytes_remaining_ = uVar3;
      if (uVar3 != 0) {
        if (((long)local_b8.btree_reader_.navigator_.height_ < 0) ||
           (local_b8.btree_reader_.navigator_.node_[local_b8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if (local_b8.current_chunk_._M_len == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/cord.h"
                          ,0x617,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_b8.current_chunk_ = (string_view)ZEXT816(0);
        }
        else {
          local_b8.current_chunk_ =
               absl::lts_20250127::cord_internal::CordRepBtreeReader::Next(&local_b8.btree_reader_);
        }
      }
      bVar4 = local_b8.bytes_remaining_ == 0;
      if (bVar4) {
        return bVar4;
      }
      iVar2 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[5])
                        (this,local_b8.current_chunk_._M_str,
                         (ulong)(uint)local_b8.current_chunk_._M_len);
      if ((char)iVar2 == '\0') {
        return bVar4;
      }
    }
    WriteCord();
LAB_002408ed:
    WriteCord();
    uVar5 = extraout_XMM0_Da;
    uVar6 = extraout_XMM0_Db;
    uVar7 = extraout_XMM0_Dc;
    uVar8 = extraout_XMM0_Dd;
LAB_002408f2:
    local_b8.current_chunk_._M_len._4_4_ = uVar6;
    local_b8.current_chunk_._M_len._0_4_ = uVar5;
    local_b8.current_chunk_._M_str._0_4_ = uVar7;
    local_b8.current_chunk_._M_str._4_4_ = uVar8;
  } while( true );
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteCord(const absl::Cord& cord) {
  for (absl::string_view chunk : cord.Chunks()) {
    if (!WriteAliasedRaw(chunk.data(), chunk.size())) {
      return false;
    }
  }
  return true;
}